

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ISingleStringReader.cpp
# Opt level: O1

void __thiscall ISingleStringReader::getWord(ISingleStringReader *this,string *str)

{
  char *__n;
  char ch;
  bool bVar1;
  int iVar2;
  
  while( true ) {
    ch = std::istream::get();
    if (ch == -1) break;
    bVar1 = IDictionary::isLetter(ch);
    if ((ch != ' ') && (!bVar1)) break;
    std::__cxx11::string::push_back((char)str);
  }
  __n = (char *)str->_M_string_length;
  if (__n == (char *)(this->m_str)._M_string_length) {
    if (__n != (char *)0x0) {
      iVar2 = bcmp((str->_M_dataplus)._M_p,(this->m_str)._M_dataplus._M_p,(size_t)__n);
      if (iVar2 != 0) goto LAB_0010a6f3;
    }
    return;
  }
LAB_0010a6f3:
  std::__cxx11::string::_M_replace((ulong)str,0,__n,0x10c0b4);
  return;
}

Assistant:

void ISingleStringReader::getWord(std::string &str) {
    char tempChar;

    while((tempChar = this->m_ifs->get()) != EOF)
    {
        if(IDictionary::isLetter(tempChar)||tempChar==' ')
        {
            str+=tempChar;
        }
        else
            break;
    }
    if(str!=m_str)
        str="";
}